

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandGlitch(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pNtk_00;
  char *pcVar2;
  float fVar3;
  uint local_3c;
  int c;
  int fVerbose;
  int Prob;
  int nPats;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pNtk_00 = Abc_FrameReadNtk(pAbc);
  fVerbose = 4000;
  c = 8;
  local_3c = 1;
  Extra_UtilGetoptReset();
  do {
    while( true ) {
      iVar1 = Extra_UtilGetopt(argc,argv,"NPvh");
      if (iVar1 == -1) {
        if (pNtk_00 == (Abc_Ntk_t *)0x0) {
          Abc_Print(-1,"Empty network.\n");
          return 1;
        }
        iVar1 = Abc_NtkIsLogic(pNtk_00);
        if (iVar1 != 0) {
          iVar1 = Abc_NtkIsMappedLogic(pNtk_00);
          if ((iVar1 == 0) && (iVar1 = Abc_NtkGetFaninMax(pNtk_00), 6 < iVar1)) {
            printf("Currently computes glitching only for K-LUT networks with K <= 6.\n");
          }
          else {
            fVar3 = Abc_NtkMfsTotalGlitching(pNtk_00,fVerbose,c,local_3c);
            Abc_Print(1,"Glitching adds %7.2f %% of signal transitions, compared to switching.\n",
                      (double)fVar3);
          }
          return 0;
        }
        Abc_Print(-1,"This command can only be applied to a mapped logic network.\n");
        return 1;
      }
      if (iVar1 == 0x4e) break;
      if (iVar1 == 0x50) {
        if (argc <= globalUtilOptind) {
          Abc_Print(-1,"Command line switch \"-P\" should be followed by an integer.\n");
          goto LAB_0026b267;
        }
        c = atoi(argv[globalUtilOptind]);
        globalUtilOptind = globalUtilOptind + 1;
        if (c < 1) goto LAB_0026b267;
      }
      else {
        if ((iVar1 == 0x68) || (iVar1 != 0x76)) goto LAB_0026b267;
        local_3c = local_3c ^ 1;
      }
    }
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-N\" should be followed by an integer.\n");
      break;
    }
    fVerbose = atoi(argv[globalUtilOptind]);
    globalUtilOptind = globalUtilOptind + 1;
  } while (0 < fVerbose);
LAB_0026b267:
  Abc_Print(-2,"usage: glitch [-NP <num>] [-vh]\n");
  Abc_Print(-2,"\t           comparing glitching activity to switching activity\n");
  Abc_Print(-2,
            "\t-N <num> : the number of random patterns to use (0 < num < 1000000) [default = %d]\n"
            ,(ulong)(uint)fVerbose);
  Abc_Print(-2,"\t-P <num> : once in how many cycles an input changes its value [default = %d]\n",
            (ulong)(uint)c);
  pcVar2 = "no";
  if (local_3c != 0) {
    pcVar2 = "yes";
  }
  Abc_Print(-2,"\t-v       : toggle printing optimization summary [default = %s]\n",pcVar2);
  Abc_Print(-2,"\t-h       : print the command usage\n");
  return 1;
}

Assistant:

int Abc_CommandGlitch( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int nPats    = 4000;
    int Prob     =    8;
    int fVerbose =    1;
    int c;

    // set defaults
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "NPvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            nPats = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nPats < 1 )
                goto usage;
            break;
        case 'P':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-P\" should be followed by an integer.\n" );
                goto usage;
            }
            Prob = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( Prob < 1 )
                goto usage;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsLogic(pNtk) )
    {
        Abc_Print( -1, "This command can only be applied to a mapped logic network.\n" );
        return 1;
    }
    if ( Abc_NtkIsMappedLogic(pNtk) || Abc_NtkGetFaninMax(pNtk) <= 6 )
        Abc_Print( 1, "Glitching adds %7.2f %% of signal transitions, compared to switching.\n", Abc_NtkMfsTotalGlitching(pNtk, nPats, Prob, fVerbose) );
    else
        printf( "Currently computes glitching only for K-LUT networks with K <= 6.\n" );
    return 0;

usage:
    Abc_Print( -2, "usage: glitch [-NP <num>] [-vh]\n" );
    Abc_Print( -2, "\t           comparing glitching activity to switching activity\n" );
    Abc_Print( -2, "\t-N <num> : the number of random patterns to use (0 < num < 1000000) [default = %d]\n", nPats );
    Abc_Print( -2, "\t-P <num> : once in how many cycles an input changes its value [default = %d]\n", Prob );
    Abc_Print( -2, "\t-v       : toggle printing optimization summary [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    return 1;
}